

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O1

void __thiscall jpge::jpeg_encoder::load_block_16_8(jpeg_encoder *this,int x,int c)

{
  uint8 *puVar1;
  uint8 *puVar2;
  int iVar3;
  sample_array_t *psVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  psVar4 = this->m_sample_array;
  lVar5 = (long)(x * 0x30 + c);
  uVar7 = 0xfffffffffffffffe;
  iVar3 = 0;
  iVar8 = 2;
  do {
    iVar6 = iVar3;
    puVar1 = this->m_mcu_lines[uVar7 + 2];
    puVar2 = this->m_mcu_lines[uVar7 + 3];
    *psVar4 = ((uint)puVar1[lVar5] + iVar6 + (uint)puVar2[lVar5] + (uint)puVar1[lVar5 + 3] +
               (uint)puVar2[lVar5 + 3] >> 2) - 0x80;
    psVar4[1] = ((uint)puVar1[lVar5 + 6] + iVar8 + (uint)puVar2[lVar5 + 6] + (uint)puVar1[lVar5 + 9]
                 + (uint)puVar2[lVar5 + 9] >> 2) - 0x80;
    psVar4[2] = ((uint)puVar1[lVar5 + 0xc] + iVar6 +
                 (uint)puVar2[lVar5 + 0xc] + (uint)puVar1[lVar5 + 0xf] + (uint)puVar2[lVar5 + 0xf]
                >> 2) - 0x80;
    psVar4[3] = ((uint)puVar1[lVar5 + 0x12] + iVar8 +
                 (uint)puVar2[lVar5 + 0x12] + (uint)puVar1[lVar5 + 0x15] +
                 (uint)puVar2[lVar5 + 0x15] >> 2) - 0x80;
    psVar4[4] = ((uint)puVar1[lVar5 + 0x18] + iVar6 +
                 (uint)puVar2[lVar5 + 0x18] + (uint)puVar1[lVar5 + 0x1b] +
                 (uint)puVar2[lVar5 + 0x1b] >> 2) - 0x80;
    psVar4[5] = ((uint)puVar1[lVar5 + 0x1e] + iVar8 +
                 (uint)puVar2[lVar5 + 0x1e] + (uint)puVar1[lVar5 + 0x21] +
                 (uint)puVar2[lVar5 + 0x21] >> 2) - 0x80;
    psVar4[6] = ((uint)puVar1[lVar5 + 0x24] + iVar6 +
                 (uint)puVar2[lVar5 + 0x24] + (uint)puVar1[lVar5 + 0x27] +
                 (uint)puVar2[lVar5 + 0x27] >> 2) - 0x80;
    psVar4[7] = ((uint)puVar1[lVar5 + 0x2a] + iVar8 +
                 (uint)puVar2[lVar5 + 0x2a] + (uint)puVar1[lVar5 + 0x2d] +
                 (uint)puVar2[lVar5 + 0x2d] >> 2) - 0x80;
    psVar4 = psVar4 + 8;
    uVar7 = uVar7 + 2;
    iVar3 = iVar8;
    iVar8 = iVar6;
  } while (uVar7 < 0xe);
  return;
}

Assistant:

void jpeg_encoder::load_block_16_8(int x, int c) {
  uint8 *pSrc1, *pSrc2;
  sample_array_t* pDst = m_sample_array;
  x = (x * (16 * 3)) + c;
  int a = 0, b = 2;
  for (int i = 0; i < 16; i += 2, pDst += 8) {
    pSrc1 = m_mcu_lines[i + 0] + x;
    pSrc2 = m_mcu_lines[i + 1] + x;
    pDst[0] = ((pSrc1[0 * 3] + pSrc1[1 * 3] + pSrc2[0 * 3] + pSrc2[1 * 3] + a) >> 2) - 128;
    pDst[1] = ((pSrc1[2 * 3] + pSrc1[3 * 3] + pSrc2[2 * 3] + pSrc2[3 * 3] + b) >> 2) - 128;
    pDst[2] = ((pSrc1[4 * 3] + pSrc1[5 * 3] + pSrc2[4 * 3] + pSrc2[5 * 3] + a) >> 2) - 128;
    pDst[3] = ((pSrc1[6 * 3] + pSrc1[7 * 3] + pSrc2[6 * 3] + pSrc2[7 * 3] + b) >> 2) - 128;
    pDst[4] = ((pSrc1[8 * 3] + pSrc1[9 * 3] + pSrc2[8 * 3] + pSrc2[9 * 3] + a) >> 2) - 128;
    pDst[5] = ((pSrc1[10 * 3] + pSrc1[11 * 3] + pSrc2[10 * 3] + pSrc2[11 * 3] + b) >> 2) - 128;
    pDst[6] = ((pSrc1[12 * 3] + pSrc1[13 * 3] + pSrc2[12 * 3] + pSrc2[13 * 3] + a) >> 2) - 128;
    pDst[7] = ((pSrc1[14 * 3] + pSrc1[15 * 3] + pSrc2[14 * 3] + pSrc2[15 * 3] + b) >> 2) - 128;
    int temp = a;
    a = b;
    b = temp;
  }
}